

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O1

void __thiscall
validation_layer::parameterValidationChecker::~parameterValidationChecker
          (parameterValidationChecker *this)

{
  if (this->enableParameterValidation == true) {
    if (parameterChecker != (long *)0x0) {
      (**(code **)(*parameterChecker + 0xcb8))();
    }
    if (DAT_002015d8 != (long *)0x0) {
      (**(code **)(*DAT_002015d8 + 0x458))();
    }
    if (DAT_002015d0 != (long *)0x0) {
      (**(code **)(*DAT_002015d0 + 0x958))();
      return;
    }
  }
  return;
}

Assistant:

parameterValidationChecker::~parameterValidationChecker() {
        if(enableParameterValidation) {
            delete parameterChecker.zeValidation;
            delete parameterChecker.zetValidation;
            delete parameterChecker.zesValidation;
        }
    }